

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O3

void CVmImageLoader::load_resources_from_fp(osfildef *fp,char *fname,CVmHostIfc *hostifc)

{
  long lVar1;
  void *pvVar2;
  long *in_FS_OFFSET;
  CVmImageLoaderMres_std res_ifc;
  err_frame_t err_cur__;
  CVmImageLoaderMres local_118;
  CVmHostIfc *local_110;
  int local_108;
  uint local_100 [2];
  long local_f8;
  void *local_f0;
  __jmp_buf_tag local_e8;
  
  local_108 = (*hostifc->_vptr_CVmHostIfc[10])(hostifc);
  local_118._vptr_CVmImageLoaderMres = (_func_int **)&PTR__CVmImageLoaderMres_003665f0;
  local_110 = hostifc;
  G_err_frame::__tls_init();
  local_f8 = *in_FS_OFFSET;
  G_err_frame::__tls_init();
  *in_FS_OFFSET = (long)local_100;
  local_100[0] = _setjmp(&local_e8);
  if (local_100[0] == 0) {
    load_resources_from_fp(fp,fname,&local_118);
  }
  lVar1 = local_f8;
  if (local_100[0] == 1) {
    local_100[0] = 2;
  }
  G_err_frame::__tls_init();
  *in_FS_OFFSET = lVar1;
  if ((local_100[0] & 0x4001) != 0) {
    G_err_frame::__tls_init();
    if ((*(byte *)*in_FS_OFFSET & 2) != 0) {
      G_err_frame::__tls_init();
      free(*(void **)(*in_FS_OFFSET + 0x10));
    }
    pvVar2 = local_f0;
    G_err_frame::__tls_init();
    *(void **)(*in_FS_OFFSET + 0x10) = pvVar2;
    err_rethrow();
  }
  if ((local_100[0] & 2) != 0) {
    free(local_f0);
  }
  return;
}

Assistant:

void CVmImageLoader::load_resources_from_fp(osfildef *fp,
                                            const char *fname,
                                            CVmHostIfc *hostifc)
{
    int fileno;

    /* ask the host system to assign a number to the file */
    fileno = hostifc->add_resfile(fname);

    /* set up a resource interface with the file number */
    CVmImageLoaderMres_std res_ifc(fileno, hostifc);

    err_try
    {
        /* load the resources */
        load_resources_from_fp(fp, fname, &res_ifc);
    }